

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O2

void __thiscall
soplex::SPxSolverBase<double>::setStarter
          (SPxSolverBase<double> *this,SPxStarter<double> *x,bool destroy)

{
  if ((this->freeStarter == true) && (this->thestarter != (SPxStarter<double> *)0x0)) {
    (*this->thestarter->_vptr_SPxStarter[1])();
  }
  this->thestarter = x;
  if (x != (SPxStarter<double> *)0x0) {
    (*x->_vptr_SPxStarter[5])(x,&(this->super_SPxLPBase<double>)._tolerances);
  }
  this->freeStarter = destroy;
  return;
}

Assistant:

void SPxSolverBase<R>::setStarter(SPxStarter<R>* x, const bool destroy)
{

   assert(!freeStarter || thestarter != nullptr);

   if(freeStarter)
   {
      delete thestarter;
      thestarter = nullptr;
   }

   thestarter = x;

   if(thestarter != nullptr)
      thestarter->setTolerances(this->tolerances());

   freeStarter = destroy;
}